

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int VP8LHashChainInit(VP8LHashChain *p,int size)

{
  void *pvVar1;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar1 = WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (size_t)in_RDI);
  *in_RDI = (long)pvVar1;
  if (*in_RDI != 0) {
    *(undefined4 *)(in_RDI + 1) = in_ESI;
  }
  return (uint)(*in_RDI != 0);
}

Assistant:

int VP8LHashChainInit(VP8LHashChain* const p, int size) {
  assert(p->size == 0);
  assert(p->offset_length == NULL);
  assert(size > 0);
  p->offset_length =
      (uint32_t*)WebPSafeMalloc(size, sizeof(*p->offset_length));
  if (p->offset_length == NULL) return 0;
  p->size = size;

  return 1;
}